

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

void __thiscall
Js::SourceTextModuleRecord::SetParent
          (SourceTextModuleRecord *this,SourceTextModuleRecord *parentRecord,LPCOLESTR moduleName)

{
  code *pcVar1;
  LPCOLESTR this_00;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar6;
  Recycler *pRVar7;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar8;
  TrackAllocData local_58;
  Recycler *local_30;
  Recycler *recycler;
  LPCOLESTR local_20;
  LPCOLESTR moduleName_local;
  SourceTextModuleRecord *parentRecord_local;
  SourceTextModuleRecord *this_local;
  
  local_20 = moduleName;
  moduleName_local = (LPCOLESTR)parentRecord;
  parentRecord_local = this;
  if (parentRecord == (SourceTextModuleRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x2ec,"(parentRecord != nullptr)","parentRecord != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = moduleName_local;
  pSVar4 = GetScriptContext(this);
  EnsureChildModuleSet((SourceTextModuleRecord *)this_00,pSVar4);
  pBVar5 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)(moduleName_local + 0x48));
  bVar2 = JsUtil::
          BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(pBVar5,&local_20);
  if (!bVar2) {
    pBVar5 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->((WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                           *)(moduleName_local + 0x48));
    recycler = (Recycler *)this;
    JsUtil::
    BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew(pBVar5,&local_20,(SourceTextModuleRecord **)&recycler);
    ppLVar6 = Memory::WriteBarrierPtr::operator_cast_to_List__
                        ((WriteBarrierPtr *)&this->parentModuleList);
    if (*ppLVar6 ==
        (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      pSVar4 = GetScriptContext(this);
      pRVar7 = ScriptContext::GetRecycler(pSVar4);
      local_30 = pRVar7;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &JsUtil::
                  List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                 ,0x2f5);
      pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_58);
      pLVar8 = (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)new<Memory::Recycler>(0x30,pRVar7,0x43c4b0);
      JsUtil::
      List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::List(pLVar8,local_30,4);
      Memory::
      WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
      ::operator=(&this->parentModuleList,pLVar8);
    }
    pLVar8 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->parentModuleList);
    bVar2 = JsUtil::ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>::
            Contains(&pLVar8->
                      super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                     ,(SourceTextModuleRecord **)&moduleName_local);
    if (!bVar2) {
      pLVar8 = Memory::
               WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
               ::operator->(&this->parentModuleList);
      JsUtil::
      List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(pLVar8,(SourceTextModuleRecord **)&moduleName_local);
    }
    bVar2 = IsEvaluating(this);
    if (bVar2) {
      IncrementAwaited((SourceTextModuleRecord *)moduleName_local);
    }
  }
  return;
}

Assistant:

void SourceTextModuleRecord::SetParent(SourceTextModuleRecord* parentRecord, LPCOLESTR moduleName)
    {
        Assert(parentRecord != nullptr);
        parentRecord->EnsureChildModuleSet(GetScriptContext());
        if (!parentRecord->childrenModuleSet->ContainsKey(moduleName))
        {
            parentRecord->childrenModuleSet->AddNew(moduleName, this);

            if (this->parentModuleList == nullptr)
            {
                Recycler* recycler = GetScriptContext()->GetRecycler();
                this->parentModuleList = RecyclerNew(recycler, ModuleRecordList, recycler);
            }

            if (!this->parentModuleList->Contains(parentRecord))
            {
                this->parentModuleList->Add(parentRecord);
            }

            if (IsEvaluating())
            {
                parentRecord->IncrementAwaited();
            }
        }
    }